

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_chacha20_poly1305.c
# Opt level: O0

int chacha20_poly1305_final(void *vctx,uchar *out,size_t *outl,size_t outsize)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  PROV_CIPHER_HW_CHACHA20_POLY1305 *hw;
  PROV_CIPHER_CTX *ctx;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0xa8);
  iVar2 = ossl_prov_is_running();
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    iVar2 = (**(code **)(lVar1 + 0x18))(in_RDI,in_RSI,in_RDX,0);
    if (iVar2 < 1) {
      local_4 = 0;
    }
    else {
      *in_RDX = 0;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int chacha20_poly1305_final(void *vctx, unsigned char *out, size_t *outl,
                                   size_t outsize)
{
    PROV_CIPHER_CTX *ctx = (PROV_CIPHER_CTX *)vctx;
    PROV_CIPHER_HW_CHACHA20_POLY1305 *hw =
        (PROV_CIPHER_HW_CHACHA20_POLY1305 *)ctx->hw;

    if (!ossl_prov_is_running())
        return 0;

    if (hw->aead_cipher(ctx, out, outl, NULL, 0) <= 0)
        return 0;

    *outl = 0;
    return 1;
}